

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

int fits_rebin_wcsd(fitsfile *fptr,int naxis,double *amin,double *binsize,int *status)

{
  bool bVar1;
  fitsfile *pfVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  int value;
  int tstatus;
  double dvalue;
  fitsfile *local_120;
  double *local_118;
  ulong local_110;
  ulong local_108;
  int local_fc;
  double *local_f8;
  ulong local_f0;
  int *local_e8;
  ulong local_e0;
  double local_d8;
  undefined8 uStack_d0;
  char keyname [75];
  char svalue [71];
  
  if (*status < 1) {
    local_108 = (ulong)(uint)naxis;
    if (naxis < 1) {
      local_108 = 0;
    }
    local_e0 = (ulong)(uint)-(int)local_108;
    uVar5 = 0;
    local_120 = fptr;
    local_118 = binsize;
    local_f8 = amin;
    local_e8 = status;
    while (uVar5 != local_108) {
      tstatus = 0;
      iVar4 = (int)(uVar5 + 1);
      local_110 = uVar5;
      ffkeyn("CRVAL",iVar4,keyname,&tstatus);
      pfVar2 = local_120;
      ffgky(local_120,0x52,keyname,&dvalue,(char *)0x0,&tstatus);
      local_fc = tstatus;
      local_d8 = dvalue;
      uStack_d0 = 0;
      tstatus = 0;
      local_f0 = uVar5 + 1;
      ffkeyn("CRPIX",iVar4,keyname,&tstatus);
      ffgky(pfVar2,0x52,keyname,&dvalue,(char *)0x0,&tstatus);
      bVar6 = true;
      if (tstatus == 0) {
        bVar6 = (dvalue != 1.0 || local_d8 != 1.0) || local_fc != 0;
        dvalue = (dvalue - local_f8[local_110]) / local_118[local_110] + 0.5;
        ffmkyd(local_120,keyname,dvalue,-0xe,(char *)0x0,&tstatus);
      }
      uVar5 = local_f0;
      tstatus = 0;
      iVar4 = (int)local_f0;
      ffkeyn("CDELT",iVar4,keyname,&tstatus);
      ffgky(local_120,0x52,keyname,&dvalue,(char *)0x0,&tstatus);
      if (tstatus == 0) {
        bVar1 = dvalue == 1.0;
        dvalue = dvalue * local_118[local_110];
        ffmkyd(local_120,keyname,dvalue,-0xe,(char *)0x0,&tstatus);
        if (bVar1 && !bVar6) {
          dvalue = 1.0;
          ffkeyn("CRPIX",iVar4,keyname,&tstatus);
          pfVar2 = local_120;
          ffmkyd(local_120,keyname,dvalue,-0xe,(char *)0x0,&tstatus);
          ffkeyn("CRVAL",(int)local_f0,keyname,&tstatus);
          dvalue = local_118[local_110] * 0.5 + local_f8[local_110];
          ffmkyd(pfVar2,keyname,dvalue,-0xe,(char *)0x0,&tstatus);
        }
      }
      else {
        for (value = 1; (int)local_e0 + value != 1; value = value + 1) {
          tstatus = 0;
          ffkeyn("CD",value,svalue,&tstatus);
          sVar3 = strlen(svalue);
          (svalue + sVar3)[0] = '_';
          (svalue + sVar3)[1] = '\0';
          ffkeyn(svalue,iVar4,keyname,&tstatus);
          ffgky(local_120,0x52,keyname,&dvalue,(char *)0x0,&tstatus);
          if (tstatus == 0) {
            dvalue = dvalue * local_118[local_110];
            ffmkyd(local_120,keyname,dvalue,-0xe,(char *)0x0,&tstatus);
          }
        }
      }
    }
    return *local_e8;
  }
  return *status;
}

Assistant:

int fits_rebin_wcsd(
      fitsfile *fptr,   /* I - pointer to table to be binned           */
      int naxis,        /* I - number of axes in the histogram image   */
      double *amin,     /* I - first pixel include in each axis        */
      double *binsize,  /* I - binning factor for each axis            */
      int *status)      
{      
   /*  Update the  WCS keywords that define the location of the reference */
   /*  pixel, and the pixel size, along each axis.   */

    int ii, jj, tstatus, reset ;
    char keyname[FLEN_KEYWORD], svalue[FLEN_VALUE];
    double dvalue;
    
    if (*status > 0)
        return(*status);
  
    for (ii = 0; ii < naxis; ii++)
    {
       reset = 0;  /* flag to reset the reference pixel */
       tstatus = 0;
       ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
       /* get previous (pre-binning) value */
       ffgky(fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus); 
       if (!tstatus && dvalue == 1.0) {
           reset = 1;
       }

       tstatus = 0;
       /*  CRPIXn - update location of the ref. pix. in the binned image */
       ffkeyn("CRPIX", ii + 1, keyname, &tstatus);

       /* get previous (pre-binning) value */
       ffgky(fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus); 

       if (!tstatus)
       {
           if (dvalue != 1.0)
	      reset = 0;

           /* updated value to give pixel location after binning */
           dvalue = (dvalue - amin[ii]) / ((double) binsize[ii]) + .5;  

           fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);
       } else {
          reset = 0;
       }

       /*  CDELTn - update unit size of pixels  */
       tstatus = 0;
       ffkeyn("CDELT", ii + 1, keyname, &tstatus);

       /* get previous (pre-binning) value */
       ffgky(fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus); 

       if (!tstatus)
       {
           if (dvalue != 1.0)
	      reset = 0;

           /* updated to give post-binning value */
           dvalue = dvalue * binsize[ii];  

           fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);
       }
       else
       {   /* no CDELTn keyword, so look for a CDij keywords */
          reset = 0;

          for (jj = 0; jj < naxis; jj++)
	  {
             tstatus = 0;
             ffkeyn("CD", jj + 1, svalue, &tstatus);
	     strcat(svalue,"_");
	     ffkeyn(svalue, ii + 1, keyname, &tstatus);

             /* get previous (pre-binning) value */
             ffgky(fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus); 

             if (!tstatus)
             {
                /* updated to give post-binning value */
               dvalue = dvalue * binsize[ii];  

               fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);
             }
	  }
       }

       if (reset) {
          /* the original CRPIX, CRVAL, and CDELT keywords were all = 1.0 */
	  /* In this special case, reset the reference pixel to be the */
	  /* first pixel in the array (instead of possibly far off the array) */
 
           dvalue = 1.0;
           ffkeyn("CRPIX", ii + 1, keyname, &tstatus);
           fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);

           ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
	   dvalue = amin[ii] + (binsize[ii] / 2.0);	  
           fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);
	}

    }
    return(*status);
}